

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FillLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_filllike(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  FillLikeLayerParams *pFVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_filllike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_filllike(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pFVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::FillLikeLayerParams>(arena);
    (this->layer_).filllike_ = pFVar2;
  }
  return (FillLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FillLikeLayerParams* NeuralNetworkLayer::_internal_mutable_filllike() {
  if (!_internal_has_filllike()) {
    clear_layer();
    set_has_filllike();
    layer_.filllike_ = CreateMaybeMessage< ::CoreML::Specification::FillLikeLayerParams >(GetArenaForAllocation());
  }
  return layer_.filllike_;
}